

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3b35295::DumpVisitor::onValue(DumpVisitor *this,uint64_t U,bool LEB)

{
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,LEB) != 0) {
    llvm::encodeULEB128(U,this->OS,0);
    return;
  }
  writeInteger<unsigned_long>
            (U,this->OS,
             ((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)->
             IsLittleEndian);
  return;
}

Assistant:

void onValue(const uint64_t U, const bool LEB = false) override {
    if (LEB)
      encodeULEB128(U, OS);
    else
      writeInteger(U, OS, DebugInfo.IsLittleEndian);
  }